

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_mix_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t id,uint32_t left,uint32_t right,
          uint32_t lerp)

{
  bool bVar1;
  SPIRType *pSVar2;
  SPIRType *type;
  char *op;
  bool bVar3;
  bool local_bd;
  undefined1 local_90 [8];
  string expr;
  string local_58 [6];
  bool trivial_mix;
  bool has_boolean_mix;
  string mix_op;
  SPIRType *restype;
  SPIRType *lerptype;
  uint32_t lerp_local;
  uint32_t right_local;
  uint32_t left_local;
  uint32_t id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  pSVar2 = Compiler::expression_type(&this->super_Compiler,lerp);
  type = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  if ((type->pointer & 1U) != 0) {
    Compiler::register_write(&this->super_Compiler,left);
    Compiler::register_write(&this->super_Compiler,right);
  }
  ::std::__cxx11::string::string(local_58);
  bVar3 = false;
  if ((*(this->backend).boolean_mix_function != '\0') &&
     (((((this->options).es & 1U) == 0 || (bVar3 = true, (this->options).version < 0x136)) &&
      (bVar3 = false, ((this->options).es & 1U) == 0)))) {
    bVar3 = 0x1c1 < (this->options).version;
  }
  bVar1 = to_trivial_mix_op(this,type,(string *)local_58,left,right,lerp);
  if (pSVar2->vecsize == 1) {
    bVar3 = false;
  }
  if (bVar1) {
    op = (char *)::std::__cxx11::string::c_str();
    emit_unary_func_op(this,result_type,id,lerp,op);
  }
  else if ((bVar3) || (*(int *)&(pSVar2->super_IVariant).field_0xc != 2)) {
    if (*(int *)&(pSVar2->super_IVariant).field_0xc == 2) {
      emit_trinary_func_op(this,result_type,id,left,right,lerp,(this->backend).boolean_mix_function)
      ;
    }
    else {
      emit_trinary_func_op(this,result_type,id,left,right,lerp,"mix");
    }
  }
  else {
    pSVar2 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
    to_ternary_expression_abi_cxx11_
              ((CompilerGLSL *)local_90,(SPIRType *)this,(uint32_t)pSVar2,lerp,right);
    bVar3 = should_forward(this,left);
    local_bd = false;
    if (bVar3) {
      bVar3 = should_forward(this,right);
      local_bd = false;
      if (bVar3) {
        local_bd = should_forward(this,lerp);
      }
    }
    emit_op(this,result_type,id,(string *)local_90,local_bd,false);
    Compiler::inherit_expression_dependencies(&this->super_Compiler,id,left);
    Compiler::inherit_expression_dependencies(&this->super_Compiler,id,right);
    Compiler::inherit_expression_dependencies(&this->super_Compiler,id,lerp);
    ::std::__cxx11::string::~string((string *)local_90);
  }
  ::std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void CompilerGLSL::emit_mix_op(uint32_t result_type, uint32_t id, uint32_t left, uint32_t right, uint32_t lerp)
{
	auto &lerptype = expression_type(lerp);
	auto &restype = get<SPIRType>(result_type);

	// If this results in a variable pointer, assume it may be written through.
	if (restype.pointer)
	{
		register_write(left);
		register_write(right);
	}

	string mix_op;
	bool has_boolean_mix = *backend.boolean_mix_function &&
	                       ((options.es && options.version >= 310) || (!options.es && options.version >= 450));
	bool trivial_mix = to_trivial_mix_op(restype, mix_op, left, right, lerp);

	// Cannot use boolean mix when the lerp argument is just one boolean,
	// fall back to regular trinary statements.
	if (lerptype.vecsize == 1)
		has_boolean_mix = false;

	// If we can reduce the mix to a simple cast, do so.
	// This helps for cases like int(bool), uint(bool) which is implemented with
	// OpSelect bool 1 0.
	if (trivial_mix)
	{
		emit_unary_func_op(result_type, id, lerp, mix_op.c_str());
	}
	else if (!has_boolean_mix && lerptype.basetype == SPIRType::Boolean)
	{
		// Boolean mix not supported on desktop without extension.
		// Was added in OpenGL 4.5 with ES 3.1 compat.
		//
		// Could use GL_EXT_shader_integer_mix on desktop at least,
		// but Apple doesn't support it. :(
		// Just implement it as ternary expressions.
		auto expr = to_ternary_expression(get<SPIRType>(result_type), lerp, right, left);
		emit_op(result_type, id, expr, should_forward(left) && should_forward(right) && should_forward(lerp));
		inherit_expression_dependencies(id, left);
		inherit_expression_dependencies(id, right);
		inherit_expression_dependencies(id, lerp);
	}
	else if (lerptype.basetype == SPIRType::Boolean)
		emit_trinary_func_op(result_type, id, left, right, lerp, backend.boolean_mix_function);
	else
		emit_trinary_func_op(result_type, id, left, right, lerp, "mix");
}